

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::WireFormat::MessageSetParser::ParseElement
          (MessageSetParser *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  DescriptorPool *this_00;
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  _Alloc_hider _Var5;
  bool bVar6;
  FieldDescriptor *pFVar7;
  ExtensionRange *pEVar8;
  ushort *p;
  Descriptor *pDVar9;
  MessageLite *this_01;
  string *psVar10;
  char *pcVar11;
  string *psVar12;
  long lVar13;
  uint32_t res;
  int size;
  ulong uVar14;
  ulong unaff_RBP;
  uint uVar15;
  uint uVar16;
  UnknownFieldSet *this_02;
  uint number;
  ushort *unaff_R13;
  ushort *puVar17;
  char cVar18;
  bool bVar19;
  pair<const_char_*,_unsigned_int> pVar20;
  pair<const_char_*,_int> pVar21;
  string_view flat;
  string payload;
  ParseContext tmp_ctx;
  ushort *local_e8;
  MessageSetParser *local_e0;
  InternalMetadata *local_d8;
  Data *local_d0;
  string local_c8;
  size_t local_a8;
  ParseContext local_a0;
  
  local_e8 = (ushort *)ptr;
  local_e0 = this;
  local_d8 = Reflection::MutableInternalMetadata(this->reflection,this->msg);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_d0 = &ctx->data_;
  number = 0;
  cVar18 = '\0';
  do {
    bVar6 = EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_e8,ctx->group_depth_);
    puVar17 = local_e8;
    if (bVar6) break;
    p = (ushort *)((long)local_e8 + 1);
    uVar14 = unaff_RBP;
    if ((byte)*local_e8 == 0x1a) {
      if (cVar18 == '\x01') {
        local_e8 = p;
        pEVar8 = Descriptor::FindExtensionRangeContainingNumber(local_e0->descriptor,number);
        if (pEVar8 == (ExtensionRange *)0x0) {
          pFVar7 = (FieldDescriptor *)0x0;
        }
        else {
          this_00 = (ctx->data_).pool;
          if (this_00 == (DescriptorPool *)0x0) {
            pFVar7 = Reflection::FindKnownExtensionByNumber(local_e0->reflection,number);
          }
          else {
            pFVar7 = DescriptorPool::FindExtensionByNumber(this_00,local_e0->descriptor,number);
          }
        }
        local_e8 = (ushort *)
                   _InternalParseAndMergeField
                             (local_e0->msg,(char *)local_e8,ctx,(ulong)number * 8 + 2,
                              local_e0->reflection,pFVar7);
        cVar18 = '\x03';
      }
      else {
        if (cVar18 == '\0') {
          bVar1 = *(byte *)p;
          if ((char)bVar1 < '\0') {
            local_e8 = p;
            pVar21 = ReadSizeFallback((char *)p,(uint)bVar1);
            auVar2 = pVar21._0_12_;
          }
          else {
            auVar2[8] = bVar1;
            auVar2._0_8_ = local_e8 + 1;
            auVar2._9_3_ = 0;
          }
          local_e8 = auVar2._0_8_;
          if (local_e8 == (ushort *)0x0) {
            cVar18 = '\0';
LAB_00338961:
            local_e8 = (ushort *)0x0;
            bVar6 = false;
            unaff_R13 = (ushort *)0x0;
          }
          else {
            local_e8 = (ushort *)
                       EpsCopyInputStream::ReadString
                                 (&ctx->super_EpsCopyInputStream,(char *)local_e8,auVar2._8_4_,
                                  &local_c8);
            bVar6 = local_e8 != (ushort *)0x0;
            if (!bVar6) {
              unaff_R13 = local_e8;
            }
            cVar18 = bVar6 * '\x02';
          }
        }
        else {
          bVar1 = *(byte *)p;
          if ((char)bVar1 < '\0') {
            local_e8 = p;
            pVar21 = ReadSizeFallback((char *)p,(uint)bVar1);
            auVar3 = pVar21._0_12_;
          }
          else {
            auVar3[8] = bVar1;
            auVar3._0_8_ = local_e8 + 1;
            auVar3._9_3_ = 0;
          }
          local_e8 = auVar3._0_8_;
          if (local_e8 == (ushort *)0x0) goto LAB_00338961;
          size = auVar3._8_4_;
          if ((long)((ctx->super_EpsCopyInputStream).buffer_end_ + (0x10 - (long)local_e8)) <
              (long)size) {
            local_e8 = (ushort *)
                       EpsCopyInputStream::SkipFallback
                                 (&ctx->super_EpsCopyInputStream,(char *)local_e8,size);
          }
          else {
            local_e8 = (ushort *)((long)local_e8 + (long)size);
          }
          bVar6 = local_e8 != (ushort *)0x0;
          if (!bVar6) {
            unaff_R13 = local_e8;
          }
        }
        bVar19 = true;
        if (!bVar6) goto LAB_003389da;
      }
LAB_003389c8:
      bVar19 = local_e8 == (ushort *)0x0;
      if (bVar19) {
        unaff_R13 = local_e8;
      }
    }
    else if ((byte)*local_e8 == 0x10) {
      uVar16 = (uint)(char)*p;
      uVar15 = (*p & uVar16) + uVar16;
      uVar14 = (ulong)(uVar15 >> 1);
      if ((short)uVar15 < 0) {
        local_e8 = (ushort *)((long)local_e8 + 3);
        lVar13 = 0xd;
        do {
          uVar16 = (uint)(char)*local_e8;
          uVar15 = (*local_e8 & uVar16) + uVar16;
          uVar14 = ((ulong)uVar15 - 2 << ((byte)lVar13 & 0x3f)) + uVar14;
          if (-1 < (short)uVar15) {
            local_e8 = (ushort *)((long)local_e8 + (ulong)(uVar15 < uVar16) + 1);
            goto LAB_00338799;
          }
          lVar13 = lVar13 + 0xe;
          local_e8 = local_e8 + 1;
        } while (lVar13 != 0x45);
        local_e8 = (ushort *)0x0;
        uVar14 = unaff_RBP;
      }
      else {
        local_e8 = (ushort *)((long)local_e8 + (ulong)(uVar15 < uVar16) + 2);
      }
LAB_00338799:
      bVar19 = true;
      if ((local_e8 == (ushort *)0x0) || (uVar15 = (uint)uVar14, uVar15 == 0)) {
        unaff_R13 = (ushort *)0x0;
      }
      else {
        bVar19 = false;
        if (cVar18 == '\0') {
          cVar18 = '\x01';
          number = uVar15;
        }
        else if (cVar18 == '\x02') {
          if (local_d0->pool == (DescriptorPool *)0x0) {
            pFVar7 = Reflection::FindKnownExtensionByNumber(local_e0->reflection,uVar15);
          }
          else {
            pFVar7 = DescriptorPool::FindExtensionByNumber
                               (local_d0->pool,local_e0->descriptor,uVar15);
          }
          if ((pFVar7 == (FieldDescriptor *)0x0) ||
             (pDVar9 = FieldDescriptor::message_type(pFVar7), pDVar9 == (Descriptor *)0x0)) {
            _Var5._M_p = local_c8._M_dataplus._M_p;
            local_a8 = local_c8._M_string_length;
            if ((local_d8->ptr_ & 1U) == 0) {
              this_02 = InternalMetadata::
                        mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(local_d8);
            }
            else {
              this_02 = (UnknownFieldSet *)((local_d8->ptr_ & 0xfffffffffffffffeU) + 8);
            }
            psVar10 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(this_02,uVar15);
            cVar18 = '\x03';
            std::__cxx11::string::_M_replace
                      ((ulong)psVar10,0,(char *)psVar10->_M_string_length,(ulong)_Var5._M_p);
            number = uVar15;
          }
          else {
            bVar1 = pFVar7->field_0x1;
            bVar6 = (bool)((bVar1 & 0x20) >> 5);
            if (0xbf < bVar1 == bVar6) {
              psVar12 = (string *)0x0;
            }
            else {
              psVar12 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar6,0xbf < bVar1,"is_repeated_ == label() == LABEL_REPEATED");
            }
            if (psVar12 != (string *)0x0) {
              absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_a0,
                         "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                         ,0xab7,*(undefined8 *)(psVar12 + 8),*(undefined8 *)psVar12);
              absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                        ((LogMessageFatal *)&local_a0);
            }
            if ((pFVar7->field_0x1 & 0x20) == 0) {
              this_01 = &Reflection::MutableMessage
                                   (local_e0->reflection,local_e0->msg,pFVar7,(ctx->data_).factory)
                         ->super_MessageLite;
            }
            else {
              this_01 = &Reflection::AddMessage
                                   (local_e0->reflection,local_e0->msg,pFVar7,(ctx->data_).factory)
                         ->super_MessageLite;
            }
            local_a0.super_EpsCopyInputStream.patch_buffer_[0x18] = '\0';
            local_a0.super_EpsCopyInputStream.patch_buffer_[0x19] = '\0';
            local_a0.super_EpsCopyInputStream.patch_buffer_[0x1a] = '\0';
            local_a0.super_EpsCopyInputStream.patch_buffer_[0x1b] = '\0';
            local_a0.super_EpsCopyInputStream.patch_buffer_[0x1c] = '\0';
            local_a0.super_EpsCopyInputStream.patch_buffer_[0x1d] = '\0';
            local_a0.super_EpsCopyInputStream.patch_buffer_[0x1e] = '\0';
            local_a0.super_EpsCopyInputStream.patch_buffer_[0x1f] = '\0';
            local_a0.super_EpsCopyInputStream.aliasing_ = 0;
            local_a0.super_EpsCopyInputStream.patch_buffer_[8] = '\0';
            local_a0.super_EpsCopyInputStream.patch_buffer_[9] = '\0';
            local_a0.super_EpsCopyInputStream.patch_buffer_[10] = '\0';
            local_a0.super_EpsCopyInputStream.patch_buffer_[0xb] = '\0';
            local_a0.super_EpsCopyInputStream.patch_buffer_[0xc] = '\0';
            local_a0.super_EpsCopyInputStream.patch_buffer_[0xd] = '\0';
            local_a0.super_EpsCopyInputStream.patch_buffer_[0xe] = '\0';
            local_a0.super_EpsCopyInputStream.patch_buffer_[0xf] = '\0';
            local_a0.super_EpsCopyInputStream.patch_buffer_[0x10] = '\0';
            local_a0.super_EpsCopyInputStream.patch_buffer_[0x11] = '\0';
            local_a0.super_EpsCopyInputStream.patch_buffer_[0x12] = '\0';
            local_a0.super_EpsCopyInputStream.patch_buffer_[0x13] = '\0';
            local_a0.super_EpsCopyInputStream.patch_buffer_[0x14] = '\0';
            local_a0.super_EpsCopyInputStream.patch_buffer_[0x15] = '\0';
            local_a0.super_EpsCopyInputStream.patch_buffer_[0x16] = '\0';
            local_a0.super_EpsCopyInputStream.patch_buffer_[0x17] = '\0';
            local_a0.super_EpsCopyInputStream.zcis_ = (ZeroCopyInputStream *)0x0;
            local_a0.super_EpsCopyInputStream.patch_buffer_[0] = '\0';
            local_a0.super_EpsCopyInputStream.patch_buffer_[1] = '\0';
            local_a0.super_EpsCopyInputStream.patch_buffer_[2] = '\0';
            local_a0.super_EpsCopyInputStream.patch_buffer_[3] = '\0';
            local_a0.super_EpsCopyInputStream.patch_buffer_[4] = '\0';
            local_a0.super_EpsCopyInputStream.patch_buffer_[5] = '\0';
            local_a0.super_EpsCopyInputStream.patch_buffer_[6] = '\0';
            local_a0.super_EpsCopyInputStream.patch_buffer_[7] = '\0';
            local_a0.super_EpsCopyInputStream.last_tag_minus_1_ = 0;
            local_a0.super_EpsCopyInputStream.overall_limit_ = 0x7fffffff;
            local_a0.depth_ = ctx->depth_;
            local_a0.group_depth_ = -0x80000000;
            local_a0.data_.pool = local_d0->pool;
            local_a0.data_.factory = local_d0->factory;
            flat._M_str = local_c8._M_dataplus._M_p;
            flat._M_len = local_c8._M_string_length;
            pcVar11 = EpsCopyInputStream::InitFrom(&local_a0.super_EpsCopyInputStream,flat);
            pcVar11 = MessageLite::_InternalParse(this_01,pcVar11,&local_a0);
            bVar6 = pcVar11 != (char *)0x0;
            bVar19 = local_a0.super_EpsCopyInputStream.last_tag_minus_1_ == 0;
            if (!bVar19 || !bVar6) {
              unaff_R13 = (ushort *)0x0;
            }
            cVar18 = (bVar19 && bVar6) + '\x02';
            bVar19 = !bVar19 || !bVar6;
            number = uVar15;
          }
        }
      }
    }
    else {
      bVar1 = (byte)*local_e8;
      uVar15 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        res = ((uint)bVar1 + (uint)*(byte *)p * 0x80) - 0x80;
        if ((char)*(byte *)p < '\0') {
          local_e8 = p;
          pVar20 = ReadTagFallback((char *)puVar17,res);
          auVar4 = pVar20._0_12_;
        }
        else {
          auVar4._8_4_ = res;
          auVar4._0_8_ = local_e8 + 1;
        }
        uVar15 = auVar4._8_4_;
        p = auVar4._0_8_;
      }
      local_e8 = p;
      if (uVar15 != 0 && (uVar15 & 7) != 4) {
        local_e8 = (ushort *)UnknownFieldParse(uVar15,(string *)0x0,(char *)p,ctx);
        goto LAB_003389c8;
      }
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar15 - 1;
      bVar19 = true;
      unaff_R13 = p;
    }
LAB_003389da:
    unaff_RBP = uVar14;
    puVar17 = unaff_R13;
  } while (!bVar19);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  return (char *)puVar17;
}

Assistant:

const char* ParseElement(const char* ptr, internal::ParseContext* ctx) {
    // Parse a MessageSetItem
    auto metadata = reflection->MutableInternalMetadata(msg);
    enum class State { kNoTag, kHasType, kHasPayload, kDone };
    State state = State::kNoTag;

    std::string payload;
    uint32_t type_id = 0;
    while (!ctx->Done(&ptr)) {
      // We use 64 bit tags in order to allow typeid's that span the whole
      // range of 32 bit numbers.
      uint32_t tag = static_cast<uint8_t>(*ptr++);
      if (tag == WireFormatLite::kMessageSetTypeIdTag) {
        uint64_t tmp;
        ptr = ParseBigVarint(ptr, &tmp);
        // We should fail parsing if type id is 0 after cast to uint32.
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr &&
                                       static_cast<uint32_t>(tmp) != 0);
        if (state == State::kNoTag) {
          type_id = static_cast<uint32_t>(tmp);
          state = State::kHasType;
        } else if (state == State::kHasPayload) {
          type_id = static_cast<uint32_t>(tmp);
          const FieldDescriptor* field;
          if (ctx->data().pool == nullptr) {
            field = reflection->FindKnownExtensionByNumber(type_id);
          } else {
            field =
                ctx->data().pool->FindExtensionByNumber(descriptor, type_id);
          }
          if (field == nullptr || field->message_type() == nullptr) {
            WriteLengthDelimited(
                type_id, payload,
                metadata->mutable_unknown_fields<UnknownFieldSet>());
          } else {
            Message* value =
                field->is_repeated()
                    ? reflection->AddMessage(msg, field, ctx->data().factory)
                    : reflection->MutableMessage(msg, field,
                                                 ctx->data().factory);
            const char* p;
            // We can't use regular parse from string as we have to track
            // proper recursion depth and descriptor pools. Spawn a new
            // ParseContext inheriting those attributes.
            ParseContext tmp_ctx(ParseContext::kSpawn, *ctx, &p, payload);
            GOOGLE_PROTOBUF_PARSER_ASSERT(value->_InternalParse(p, &tmp_ctx) &&
                                           tmp_ctx.EndedAtLimit());
          }
          state = State::kDone;
        }
        continue;
      } else if (tag == WireFormatLite::kMessageSetMessageTag) {
        if (state == State::kNoTag) {
          int32_t size = ReadSize(&ptr);
          GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
          ptr = ctx->ReadString(ptr, size, &payload);
          GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
          state = State::kHasPayload;
        } else if (state == State::kHasType) {
          // We're now parsing the payload
          const FieldDescriptor* field = nullptr;
          if (descriptor->IsExtensionNumber(type_id)) {
            if (ctx->data().pool == nullptr) {
              field = reflection->FindKnownExtensionByNumber(type_id);
            } else {
              field =
                  ctx->data().pool->FindExtensionByNumber(descriptor, type_id);
            }
          }
          ptr = WireFormat::_InternalParseAndMergeField(
              msg, ptr, ctx, static_cast<uint64_t>(type_id) * 8 + 2, reflection,
              field);
          state = State::kDone;
        } else {
          int32_t size = ReadSize(&ptr);
          GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
          ptr = ctx->Skip(ptr, size);
          GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        }
      } else {
        // An unknown field in MessageSetItem.
        ptr = ReadTag(ptr - 1, &tag);
        if (tag == 0 || (tag & 7) == WireFormatLite::WIRETYPE_END_GROUP) {
          ctx->SetLastTag(tag);
          return ptr;
        }
        // Skip field.
        ptr = internal::UnknownFieldParse(
            tag, static_cast<std::string*>(nullptr), ptr, ctx);
      }
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
    return ptr;
  }